

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

int Cudd_IsInHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  DdHook *local_30;
  DdHook *hook;
  Cudd_HookType where_local;
  DD_HFP f_local;
  DdManager *dd_local;
  
  switch(where) {
  case CUDD_PRE_GC_HOOK:
    local_30 = dd->preGCHook;
    break;
  case CUDD_POST_GC_HOOK:
    local_30 = dd->postGCHook;
    break;
  case CUDD_PRE_REORDERING_HOOK:
    local_30 = dd->preReorderingHook;
    break;
  case CUDD_POST_REORDERING_HOOK:
    local_30 = dd->postReorderingHook;
    break;
  default:
    return 0;
  }
  while( true ) {
    if (local_30 == (DdHook *)0x0) {
      return 0;
    }
    if (local_30->f == f) break;
    local_30 = local_30->next;
  }
  return 1;
}

Assistant:

int
Cudd_IsInHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook *hook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = dd->preGCHook;
        break;
    case CUDD_POST_GC_HOOK:
        hook = dd->postGCHook;
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = dd->preReorderingHook;
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = dd->postReorderingHook;
        break;
    default:
        return(0);
    }
    /* Scan the list and find whether the function is already there. */
    while (hook != NULL) {
        if (hook->f == f) {
            return(1);
        }
        hook = hook->next;
    }
    return(0);

}